

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::detail::_SubstrWriter::append(_SubstrWriter *this,csubstr s)

{
  char *pcVar1;
  size_t __n;
  char *__src;
  
  __n = s.len;
  __src = s.str;
  pcVar1 = (this->buf).str;
  if (pcVar1 < __src + __n && __src < pcVar1 + (this->buf).len) {
    append();
  }
  if (this->pos + __n <= (this->buf).len) {
    memcpy((this->buf).str + this->pos,__src,__n);
  }
  this->pos = this->pos + __n;
  return;
}

Assistant:

void append(csubstr s)
    {
        C4_ASSERT(!s.overlaps(buf));
        if(pos + s.len <= buf.len)
            memcpy(buf.str + pos, s.str, s.len);
        pos += s.len;
    }